

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue431(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  
  r = roaring_bitmap_create();
  roaring_bitmap_add(r,100);
  roaring_bitmap_flip_inplace(r,0,0x65);
  r_00 = roaring_bitmap_create();
  roaring_bitmap_add_range_closed(r_00,0x32,100);
  roaring_bitmap_is_subset(r_00,r);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(issue431) {
    // This is a memory access test, so we don't need to check the results.
    roaring_bitmap_t *b1 = roaring_bitmap_create();
    roaring_bitmap_add(b1, 100);
    roaring_bitmap_flip_inplace(b1, 0, 100 + 1);
    roaring_bitmap_t *b2 = roaring_bitmap_create();
    roaring_bitmap_add_range(b2, 50, 100 + 1);
    roaring_bitmap_is_subset(b2, b1);
    roaring_bitmap_free(b2);
    roaring_bitmap_free(b1);
}